

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::init
          (SamplerBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLint bindingPoint;
  value_type textureName;
  code *pcVar2;
  deUint32 dVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  deUint32 extraout_var;
  char *str;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference color;
  int local_6c;
  int texNdx_1;
  int local_58;
  int texNdx;
  allocator<unsigned_int> local_45;
  value_type_conflict2 local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  undefined1 local_28 [8];
  Random rnd;
  Functions *gl;
  SamplerBindingRenderCase *this_local;
  
  LayoutBindingRenderCase::init(&this->super_LayoutBindingRenderCase,ctx);
  pRVar4 = Context::getRenderContext((this->super_LayoutBindingRenderCase).super_TestCase.m_context)
  ;
  rnd.m_rnd.z = (*pRVar4->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_28,dVar3 ^ 0xff23a4);
  iVar1 = (this->super_LayoutBindingRenderCase).m_numBindings;
  local_44 = 0;
  std::allocator<unsigned_int>::allocator(&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_40,(long)iVar1,&local_44,&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_textures,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_45);
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_textures);
    if ((int)sVar5 <= iVar1) break;
    getRandomColor((anon_unknown_1 *)&stack0xffffffffffffff98,(Random *)local_28);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&this->m_textureColors,(value_type *)&stack0xffffffffffffff98);
    local_58 = local_58 + 1;
  }
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x6f8);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_textures);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->m_textures,0)
  ;
  (*pcVar2)(sVar5 & 0xffffffff,pvVar6);
  local_6c = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_textures);
    if ((int)sVar5 <= local_6c) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingRenderCase).m_bindings,(long)local_6c);
    bindingPoint = *pvVar7;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_textures,(long)local_6c);
    textureName = *pvVar6;
    color = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      (&this->m_textureColors,(long)local_6c);
    initializeTexture(this,bindingPoint,textureName,color);
    local_6c = local_6c + 1;
  }
  (**(code **)(rnd.m_rnd._8_8_ + 8))(0x84c0);
  de::Random::~Random((Random *)local_28);
  return extraout_EAX;
}

Assistant:

void SamplerBindingRenderCase::init (void)
{
	LayoutBindingRenderCase::init();
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	de::Random				rnd		(deStringHash(getName()) ^ 0xff23a4);


	// Initialize texture resources
	m_textures = std::vector<glw::GLuint>(m_numBindings,  0);

	// Texture colors
	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		m_textureColors.push_back(getRandomColor(rnd));

	// Textures
	gl.genTextures((glw::GLsizei)m_textures.size(), &m_textures[0]);

	for (int texNdx = 0; texNdx < (int)m_textures.size(); ++texNdx)
		initializeTexture(m_bindings[texNdx], m_textures[texNdx], m_textureColors[texNdx]);

	gl.activeTexture(GL_TEXTURE0);
}